

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

SegmentBuilder * __thiscall capnp::_::BuilderArena::getSegment(BuilderArena *this,SegmentId id)

{
  bool bVar1;
  MultiSegmentState *pMVar2;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> *this_00;
  Fault local_90;
  Fault f_1;
  Fault local_78;
  Fault f;
  uint local_68;
  DebugExpression<unsigned_int> local_64;
  undefined1 local_60 [8];
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition;
  Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *s;
  Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *_s217;
  BuilderArena *local_20;
  BuilderArena *this_local;
  SegmentBuilder *pSStack_10;
  SegmentId id_local;
  
  local_20 = this;
  this_local._4_4_ = id.value;
  kj::Id<unsigned_int,_capnp::_::Segment>::Id
            ((Id<unsigned_int,_capnp::_::Segment> *)((long)&_s217 + 4),0);
  bVar1 = kj::Id<unsigned_int,_capnp::_::Segment>::operator==
                    ((Id<unsigned_int,_capnp::_::Segment> *)((long)&this_local + 4),
                     (Id<unsigned_int,_capnp::_::Segment> *)((long)&_s217 + 4));
  if (bVar1) {
    pSStack_10 = &this->segment0;
  }
  else {
    _kjCondition._32_8_ =
         kj::_::readMaybe<capnp::_::BuilderArena::MultiSegmentState,decltype(nullptr)>
                   (&this->moreSegments);
    if ((Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *)_kjCondition._32_8_ ==
        (Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19],unsigned_int&>
                (&local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/arena.c++"
                 ,0xdd,FAILED,(char *)0x0,"\"invalid segment id\", id.value",
                 (char (*) [19])"invalid segment id",(uint *)((long)&this_local + 4));
      kj::_::Debug::Fault::fatal(&local_90);
    }
    local_68 = this_local._4_4_ - 1;
    local_64 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_68);
    pMVar2 = kj::Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t>::get
                       ((Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *)
                        _kjCondition._32_8_);
    f.exception = (Exception *)
                  kj::Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_>::size
                            (&pMVar2->builders);
    kj::_::DebugExpression<unsigned_int>::operator<
              ((DebugComparison<unsigned_int,_unsigned_long> *)local_60,&local_64,
               (unsigned_long *)&f);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_60);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&,char_const(&)[19],unsigned_int&>
                (&local_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/arena.c++"
                 ,0xda,FAILED,"id.value - 1 < s.get()->builders.size()",
                 "_kjCondition,\"invalid segment id\", id.value",
                 (DebugComparison<unsigned_int,_unsigned_long> *)local_60,
                 (char (*) [19])"invalid segment id",(uint *)((long)&this_local + 4));
      kj::_::Debug::Fault::fatal(&local_78);
    }
    pMVar2 = kj::Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t>::get
                       ((Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *)
                        _kjCondition._32_8_);
    this_00 = kj::Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_>::operator[]
                        (&pMVar2->builders,(ulong)(this_local._4_4_ - 1));
    pSStack_10 = kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>::get(this_00);
  }
  return pSStack_10;
}

Assistant:

SegmentBuilder* BuilderArena::getSegment(SegmentId id) {
  // This method is allowed to fail if the segment ID is not valid.
  if (id == SegmentId(0)) {
    return &segment0;
  } else {
    KJ_IF_SOME(s, moreSegments) {
      KJ_REQUIRE(id.value - 1 < s.get()->builders.size(), "invalid segment id", id.value);
      return const_cast<SegmentBuilder*>(s.get()->builders[id.value - 1].get());
    } else {
      KJ_FAIL_REQUIRE("invalid segment id", id.value);
    }
  }